

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ConfigUseClauseSyntax::setChild
          (ConfigUseClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004813dc + *(int *)(&DAT_004813dc + index * 4)))();
  return;
}

Assistant:

void ConfigUseClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: use = child.token(); return;
        case 1: name = child.node() ? &child.node()->as<ConfigCellIdentifierSyntax>() : nullptr; return;
        case 2: paramAssignments = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 3: colon = child.token(); return;
        case 4: config = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}